

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::applySpirvDecorate
          (TGlslangToSpvTraverser *this,TType *type,Id id,optional<int> member)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TSpirvDecorate *this_00;
  vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  *this_01;
  reference ppTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  *this_02;
  reference ppTVar4;
  TConstUnionArray *this_03;
  TConstUnion *this_04;
  TString *this_05;
  uint *puVar5;
  char *local_128;
  char *string;
  TIntermConstantUnion *extraOperand_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  TVector<const_glslang::TIntermConstantUnion_*> *__range2_1;
  vector<const_char_*,_std::allocator<const_char_*>_> strings;
  pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *decorateString;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *__range1_1;
  TIntermTyped *local_c0;
  TIntermTyped *extraOperand;
  const_iterator __end3;
  const_iterator __begin3;
  TVector<const_glslang::TIntermTyped_*> *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operandIds;
  pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *decorateId;
  const_iterator __end2;
  const_iterator __begin2;
  TMap<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literals;
  pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *decorate;
  const_iterator __end1;
  const_iterator __begin1;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *__range1;
  TSpirvDecorate *spirvDecorate;
  Id id_local;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  optional<int> member_local;
  
  this_local = (TGlslangToSpvTraverser *)
               member.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>;
  iVar2 = (*type->_vptr_TType[0xb])();
  bVar1 = glslang::TQualifier::hasSpirvDecorate((TQualifier *)CONCAT44(extraout_var,iVar2));
  if (!bVar1) {
    __assert_fail("type.getQualifier().hasSpirvDecorate()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x14b8,
                  "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                 );
  }
  iVar2 = (*type->_vptr_TType[0xb])();
  this_00 = glslang::TQualifier::getSpirvDecorate((TQualifier *)CONCAT44(extraout_var_00,iVar2));
  __end1 = std::
           map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
           ::begin((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    *)this_00);
  decorate = (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
             std::
             map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
             ::end((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    *)this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&decorate), bVar1) {
    literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>
                  ::operator*(&__end1);
    bVar1 = std::
            vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ::empty(&(((reference)
                      literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->second).
                     super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                   );
    if (bVar1) {
      bVar1 = std::optional<int>::has_value((optional<int> *)&this_local);
      if (bVar1) {
        puVar5 = (uint *)std::optional<int>::operator*((optional<int> *)&this_local);
        spv::Builder::addMemberDecoration
                  (&this->builder,id,*puVar5,
                   *literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,-1);
      }
      else {
        spv::Builder::addDecoration
                  (&this->builder,id,
                   *literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,-1);
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      TranslateLiterals(this,(TVector<const_glslang::TIntermConstantUnion_*> *)
                             (literals.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      bVar1 = std::optional<int>::has_value((optional<int> *)&this_local);
      if (bVar1) {
        puVar5 = (uint *)std::optional<int>::operator*((optional<int> *)&this_local);
        spv::Builder::addMemberDecoration
                  (&this->builder,id,*puVar5,
                   *literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      }
      else {
        spv::Builder::addDecoration
                  (&this->builder,id,
                   *literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::optional<int>::has_value((optional<int> *)&this_local);
  if (bVar1) {
    bVar1 = std::
            map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
            ::empty(&(this_00->decorateIds).
                     super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                   );
    if (!bVar1) {
      __assert_fail("spirvDecorate.decorateIds.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x14d0,
                    "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                   );
    }
  }
  else {
    __end2 = std::
             map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
             ::begin(&(this_00->decorateIds).
                      super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                    );
    decorateId = (pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *)
                 std::
                 map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                 ::end(&(this_00->decorateIds).
                        super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                      );
    while (bVar1 = std::operator!=(&__end2,(_Self *)&decorateId), bVar1) {
      operandIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>
                    ::operator*(&__end2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
      bVar1 = std::
              vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
              ::empty((vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
                       *)(operandIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!decorateId.second.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x14d4,
                      "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                     );
      }
      this_01 = (vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
                 *)(operandIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 2);
      __end3 = std::
               vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
               ::begin(this_01);
      extraOperand = (TIntermTyped *)
                     std::
                     vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
                     ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_glslang::TIntermTyped_*const_*,_std::vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>_>
                                         *)&extraOperand), bVar1) {
        ppTVar3 = __gnu_cxx::
                  __normal_iterator<const_glslang::TIntermTyped_*const_*,_std::vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>_>
                  ::operator*(&__end3);
        local_c0 = *ppTVar3;
        iVar2 = (*(local_c0->super_TIntermNode)._vptr_TIntermNode[0x22])();
        bVar1 = glslang::TQualifier::isFrontEndConstant
                          ((TQualifier *)CONCAT44(extraout_var_01,iVar2));
        if (bVar1) {
          __range1_1._4_4_ = createSpvConstant(this,local_c0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,
                     (value_type_conflict *)((long)&__range1_1 + 4));
        }
        else {
          iVar2 = (*(local_c0->super_TIntermNode)._vptr_TIntermNode[0x18])();
          __range1_1._0_4_ = getSymbolId(this,(TIntermSymbol *)CONCAT44(extraout_var_02,iVar2));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,
                     (value_type_conflict *)&__range1_1);
        }
        __gnu_cxx::
        __normal_iterator<const_glslang::TIntermTyped_*const_*,_std::vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>_>
        ::operator++(&__end3);
      }
      spv::Builder::addDecorationId
                (&this->builder,id,
                 *operandIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>
      ::operator++(&__end2);
    }
  }
  __end1_1 = std::
             map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
             ::begin(&(this_00->decorateStrings).
                      super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    );
  decorateString =
       (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
       std::
       map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
       ::end(&(this_00->decorateStrings).
              super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
            );
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&decorateString);
    if (!bVar1) {
      return;
    }
    strings.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>
                  ::operator*(&__end1_1);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range2_1);
    bVar1 = std::
            vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ::empty((vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     *)(strings.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_02 = (vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               *)(strings.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1);
    __end2_1 = std::
               vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               ::begin(this_02);
    extraOperand_1 =
         (TIntermConstantUnion *)
         std::
         vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
         ::end(this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_glslang::TIntermConstantUnion_*const_*,_std::vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>_>
                               *)&extraOperand_1), bVar1) {
      ppTVar4 = __gnu_cxx::
                __normal_iterator<const_glslang::TIntermConstantUnion_*const_*,_std::vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>_>
                ::operator*(&__end2_1);
      string = (char *)*ppTVar4;
      this_03 = glslang::TIntermConstantUnion::getConstArray((TIntermConstantUnion *)string);
      this_04 = glslang::TConstUnionArray::operator[](this_03,0);
      this_05 = glslang::TConstUnion::getSConst_abi_cxx11_(this_04);
      local_128 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            (this_05);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range2_1,&local_128);
      __gnu_cxx::
      __normal_iterator<const_glslang::TIntermConstantUnion_*const_*,_std::vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>_>
      ::operator++(&__end2_1);
    }
    bVar1 = std::optional<int>::has_value((optional<int> *)&this_local);
    if (bVar1) {
      puVar5 = (uint *)std::optional<int>::operator*((optional<int> *)&this_local);
      spv::Builder::addMemberDecoration
                (&this->builder,id,*puVar5,
                 *(Decoration *)
                  strings.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<const_char_*,_std::allocator<const_char_*>_> *)&__range2_1);
    }
    else {
      spv::Builder::addDecoration
                (&this->builder,id,
                 *(Decoration *)
                  strings.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<const_char_*,_std::allocator<const_char_*>_> *)&__range2_1);
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range2_1);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>
    ::operator++(&__end1_1);
  }
  __assert_fail("!decorateString.second.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                ,0x14e2,
                "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
               );
}

Assistant:

void TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType& type, spv::Id id, std::optional<int> member)
{
    assert(type.getQualifier().hasSpirvDecorate());

    const glslang::TSpirvDecorate& spirvDecorate = type.getQualifier().getSpirvDecorate();

    // Add spirv_decorate
    for (auto& decorate : spirvDecorate.decorates) {
        if (!decorate.second.empty()) {
            std::vector<unsigned> literals;
            TranslateLiterals(decorate.second, literals);
            if (member.has_value())
                builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorate.first), literals);
            else
                builder.addDecoration(id, static_cast<spv::Decoration>(decorate.first), literals);
        } else {
            if (member.has_value())
                builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorate.first));
            else
                builder.addDecoration(id, static_cast<spv::Decoration>(decorate.first));
        }
    }

    // Add spirv_decorate_id
    if (member.has_value()) {
        // spirv_decorate_id not applied to members
        assert(spirvDecorate.decorateIds.empty());
    } else {
        for (auto& decorateId : spirvDecorate.decorateIds) {
            std::vector<spv::Id> operandIds;
            assert(!decorateId.second.empty());
            for (auto extraOperand : decorateId.second) {
                if (extraOperand->getQualifier().isFrontEndConstant())
                    operandIds.push_back(createSpvConstant(*extraOperand));
                else
                    operandIds.push_back(getSymbolId(extraOperand->getAsSymbolNode()));
            }
            builder.addDecorationId(id, static_cast<spv::Decoration>(decorateId.first), operandIds);
        }
    }

    // Add spirv_decorate_string
    for (auto& decorateString : spirvDecorate.decorateStrings) {
        std::vector<const char*> strings;
        assert(!decorateString.second.empty());
        for (auto extraOperand : decorateString.second) {
            const char* string = extraOperand->getConstArray()[0].getSConst()->c_str();
            strings.push_back(string);
        }
        if (member.has_value())
            builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorateString.first), strings);
        else
            builder.addDecoration(id, static_cast<spv::Decoration>(decorateString.first), strings);
    }
}